

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::findAndNotifyPublicationTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  UnknownHandleManager *this_00;
  pointer pbVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer pbVar4;
  string_view name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Pubtargets;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  subHandles;
  ActionMessage link;
  
  this_00 = &this->unknownHandles;
  UnknownHandleManager::checkForPublications
            ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              *)&subHandles,this_00,(string *)key);
  ppVar2 = subHandles.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = subHandles.
                super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar2; ppVar3 = ppVar3 + 1) {
    link._0_8_ = ppVar3->first;
    link.source_id.gid = -2000000000;
    link.source_handle.hid = 0x69;
    link._16_8_ = &link.actionTime;
    link.counter = 0;
    link.flags = 0;
    link.sequenceID = 0;
    link.actionTime.internalTimeCode._0_1_ = 0;
    link.Tdemin.internalTimeCode = (baseType)&link.payload;
    link.Tso.internalTimeCode = 0;
    link.payload.buffer._M_elems[0] = 0;
    link.payload.buffer._M_elems._16_8_ = link.payload.buffer._M_elems + 0x20;
    link.payload.buffer._M_elems[0x18] = 0;
    link.payload.buffer._M_elems[0x19] = 0;
    link.payload.buffer._M_elems[0x1a] = 0;
    link.payload.buffer._M_elems[0x1b] = 0;
    link.payload.buffer._M_elems[0x1c] = 0;
    link.payload.buffer._M_elems[0x1d] = 0;
    link.payload.buffer._M_elems[0x1e] = 0;
    link.payload.buffer._M_elems[0x1f] = 0;
    link.payload.buffer._M_elems[0x20] = 0;
    link.payload.buffer._M_elems._48_8_ = &link.Tdemin;
    link.payload.buffer._M_elems._56_8_ = link.payload.buffer._M_elems + 0x10;
    link.payload.bufferSize = 0;
    link.payload.bufferCapacity = 0;
    link.payload.heap = (byte *)0x0;
    connectInterfaces(this,handleInfo,(uint)ppVar3->second,(BasicHandleInfo *)&link,
                      (uint)handleInfo->flags,
                      (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                       )0x4600000032);
    BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)&link);
  }
  UnknownHandleManager::checkForLinks(&Pubtargets,this_00,(string *)key);
  pbVar1 = Pubtargets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = Pubtargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    ActionMessage::ActionMessage(&link,cmd_add_named_input);
    name._M_str = (pbVar4->_M_dataplus)._M_p;
    name._M_len = pbVar4->_M_string_length;
    ActionMessage::name(&link,name);
    link._8_8_ = handleInfo->handle;
    checkForNamedInterface(this,&link);
    ActionMessage::~ActionMessage(&link);
  }
  if ((subHandles.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       subHandles.
       super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (Pubtargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      Pubtargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    UnknownHandleManager::clearPublication(this_00,(string *)key);
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForReconnectionPublications
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)&link,this_00,(string *)key);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::_M_move_assign(&subHandles,&link);
    CLI::std::
    _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~_Vector_base((_Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                     *)&link);
    for (; subHandles.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           subHandles.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        subHandles.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             subHandles.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      link._0_8_ = (subHandles.
                    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->first;
      link.source_id.gid = -2000000000;
      link.source_handle.hid = 0x69;
      link._16_8_ = &link.actionTime;
      link.counter = 0;
      link.flags = 0;
      link.sequenceID = 0;
      link.actionTime.internalTimeCode._0_1_ = 0;
      link.Tdemin.internalTimeCode = (baseType)&link.payload;
      link.Tso.internalTimeCode = 0;
      link.payload.buffer._M_elems[0] = 0;
      link.payload.buffer._M_elems._16_8_ = link.payload.buffer._M_elems + 0x20;
      link.payload.buffer._M_elems[0x18] = 0;
      link.payload.buffer._M_elems[0x19] = 0;
      link.payload.buffer._M_elems[0x1a] = 0;
      link.payload.buffer._M_elems[0x1b] = 0;
      link.payload.buffer._M_elems[0x1c] = 0;
      link.payload.buffer._M_elems[0x1d] = 0;
      link.payload.buffer._M_elems[0x1e] = 0;
      link.payload.buffer._M_elems[0x1f] = 0;
      link.payload.buffer._M_elems[0x20] = 0;
      link.payload.buffer._M_elems._48_8_ = &link.Tdemin;
      link.payload.buffer._M_elems._56_8_ = link.payload.buffer._M_elems + 0x10;
      link.payload.bufferSize = 0;
      link.payload.bufferCapacity = 0;
      link.payload.heap = (byte *)0x0;
      connectInterfaces(this,handleInfo,
                        (uint)(subHandles.
                               super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->second,
                        (BasicHandleInfo *)&link,(uint)handleInfo->flags,
                        (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                         )0x4600000032);
      BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)&link);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&Pubtargets);
  CLI::std::
  _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~_Vector_base(&subHandles.
                   super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 );
  return;
}

Assistant:

void CoreBroker::findAndNotifyPublicationTargets(BasicHandleInfo& handleInfo,
                                                 const std::string& key)
{
    auto subHandles = unknownHandles.checkForPublications(key);
    for (const auto& sub : subHandles) {
        connectInterfaces(handleInfo,
                          sub.second,
                          BasicHandleInfo(sub.first.fed_id, sub.first.handle, InterfaceType::INPUT),

                          handleInfo.flags,
                          std::make_pair(CMD_ADD_PUBLISHER, CMD_ADD_SUBSCRIBER));
    }

    auto Pubtargets = unknownHandles.checkForLinks(key);
    for (const auto& sub : Pubtargets) {
        ActionMessage link(CMD_ADD_NAMED_INPUT);
        link.name(sub);
        link.setSource(handleInfo.handle);
        checkForNamedInterface(link);
    }
    if (!(subHandles.empty() && Pubtargets.empty())) {
        unknownHandles.clearPublication(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        subHandles = unknownHandles.checkForReconnectionPublications(key);
        for (const auto& sub : subHandles) {
            connectInterfaces(handleInfo,
                              sub.second,
                              BasicHandleInfo(sub.first.fed_id,
                                              sub.first.handle,
                                              InterfaceType::INPUT),

                              handleInfo.flags,
                              std::make_pair(CMD_ADD_PUBLISHER, CMD_ADD_SUBSCRIBER));
        }
    }
}